

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O2

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  uchar *__ptr_00;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  size_t __size;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  sbyte sVar12;
  undefined4 *__src;
  bool bVar13;
  bool bVar14;
  uchar *local_b8;
  ulong local_b0;
  undefined4 local_7c;
  aec_stream strm;
  
  uVar1 = param->pixels_per_block;
  iVar7 = param->pixels_per_scanline;
  uVar2 = (int)((uVar1 - 1) + iVar7) / (int)uVar1;
  strm.block_size = uVar1;
  strm.rsi = uVar2;
  uVar3 = convert_options(param->options_mask);
  strm.flags = uVar3 | 0x40;
  strm.avail_out = *destLen;
  uVar11 = param->bits_per_pixel;
  bVar13 = uVar11 == 0x40;
  bVar14 = uVar11 == 0x20;
  strm.next_out = (uchar *)dest;
  if ((uVar11 == 0x40) || (__ptr = source, strm.bits_per_sample = uVar11, uVar11 == 0x20)) {
    strm.bits_per_sample = 8;
    __ptr = malloc(sourceLen);
    if (__ptr != (void *)0x0) {
      uVar5 = (ulong)(uVar11 >> 3);
      uVar11 = 8;
      for (uVar8 = 0; uVar8 < sourceLen / uVar5; uVar8 = uVar8 + 1) {
        for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
          *(undefined1 *)((long)__ptr + uVar9 * (sourceLen / uVar5) + uVar8) =
               *(undefined1 *)((long)source + uVar9);
        }
        source = (void *)((long)source + uVar5);
      }
      goto LAB_00101285;
    }
    __ptr = (void *)0x0;
  }
  else {
LAB_00101285:
    sVar12 = 8 < (int)uVar11;
    __n = (ulong)(byte)sVar12 + 1;
    if (0x10 < (int)uVar11) {
      sVar12 = 2;
      __n = 4;
    }
    iVar4 = uVar2 * uVar1;
    __size = (ulong)(uint)(iVar4 << sVar12) *
             ((((sourceLen >> sVar12) + (long)iVar7) - 1) / (ulong)(long)iVar7);
    __ptr_00 = (uchar *)malloc(__size);
    if (__ptr_00 != (uchar *)0x0) {
      __src = &local_7c;
      local_7c = 0;
      uVar5 = (ulong)(iVar7 << sVar12);
      lVar10 = (uint)(iVar4 - iVar7 << sVar12) + uVar5;
      lVar6 = 0;
      local_b0 = 0;
      local_b8 = __ptr_00;
      while (uVar8 = sourceLen - local_b0, local_b0 <= sourceLen && uVar8 != 0) {
        if (uVar5 <= uVar8) {
          uVar8 = uVar5;
        }
        memcpy(__ptr_00 + lVar6,(void *)((long)__ptr + local_b0),uVar8);
        local_b0 = local_b0 + uVar8;
        if ((uVar3 & 8) != 0) {
          __src = (undefined4 *)((long)__ptr + (local_b0 - __n));
        }
        for (uVar9 = 0; uVar9 < lVar10 - uVar8; uVar9 = uVar9 + __n) {
          memcpy(local_b8 + uVar9 + uVar8,__src,__n);
        }
        lVar6 = lVar6 + lVar10;
        local_b8 = local_b8 + lVar10;
      }
      strm.next_in = __ptr_00;
      strm.avail_in = __size;
      iVar4 = aec_buffer_encode(&strm);
      iVar7 = 2;
      if (iVar4 != -2) {
        iVar7 = iVar4;
      }
      *destLen = strm.total_out;
      goto LAB_00101400;
    }
  }
  __ptr_00 = (uchar *)0x0;
  iVar7 = -4;
LAB_00101400:
  free(__ptr_00);
  if ((bVar14 || bVar13) && __ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar7;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    int aec_status;
    void *padbuf;
    void *buf;
    size_t padding_size;
    size_t scanlines;
    size_t padbuf_size;
    int pixel_size;
    int interleave;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    buf = 0;
    padbuf = 0;

    interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    pixel_size = bits_to_bytes(strm.bits_per_sample);

    scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}